

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void shell_pipe_cb(int param_1,void *param_2)

{
  Fl_Text_Display *this;
  int iVar1;
  char *pcVar2;
  char *text;
  Fl_Process __stream;
  char line [1024];
  char acStack_418 [1032];
  
  text = acStack_418;
  memset(acStack_418,0,0x400);
  __stream._fpt = (FILE *)(FILE *)0x0;
  if ((s_proc._fpt == (FILE *)0x0) ||
     (pcVar2 = fgets(acStack_418,0x400,(FILE *)s_proc._fpt), __stream = s_proc,
     pcVar2 == (char *)0x0)) {
    iVar1 = fileno((FILE *)__stream._fpt);
    Fl::remove_fd(iVar1);
    pclose((FILE *)s_proc._fpt);
    s_proc._fpt = (FILE *)0x0;
    text = "... END SHELL COMMAND ...\n";
  }
  Fl_Text_Buffer::insert(shell_run_buffer,shell_run_buffer->mLength,text);
  this = shell_run_display;
  iVar1 = Fl_Text_Display::count_lines(shell_run_display,0,shell_run_buffer->mLength,true);
  Fl_Text_Display::scroll(this,iVar1,0);
  return;
}

Assistant:

void
shell_pipe_cb(FL_SOCKET, void*) {
  char	line[1024]="";		// Line from command output...

  if (s_proc.get_line(line, sizeof(line)) != NULL) {
    // Add the line to the output list...
    shell_run_buffer->append(line);
  } else {
    // End of file; tell the parent...
    Fl::remove_fd(fileno(s_proc.desc()));
    s_proc.close();
    shell_run_buffer->append("... END SHELL COMMAND ...\n");
  }

  shell_run_display->scroll(shell_run_display->count_lines(0,
                            shell_run_buffer->length(), 1), 0);
}